

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::validate_member_packing_rules_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SPIRType *type_00;
  
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id)
  ;
  uVar2 = Compiler::get_member_decoration
                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset)
  ;
  if ((ulong)(index + 1) <
      (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size) {
    uVar3 = Compiler::get_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index + 1,
                       DecorationOffset);
    if (uVar3 < uVar2) {
      __assert_fail("spirv_offset_next >= spirv_offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                    ,0x1379,
                    "bool spirv_cross::CompilerMSL::validate_member_packing_rules_msl(const SPIRType &, uint32_t) const"
                   );
    }
    uVar4 = get_declared_struct_member_size_msl(this,type,index);
    if (uVar4 <= uVar3 - uVar2) goto LAB_0022868f;
LAB_0022872f:
    bVar1 = false;
  }
  else {
LAB_0022868f:
    bVar1 = Compiler::is_array((Compiler *)this,type_00);
    if ((bVar1) &&
       (((type_00->array).super_VectorView<unsigned_int>.ptr
         [(type_00->array).super_VectorView<unsigned_int>.buffer_size - 1] != 1 ||
        ((type_00->array_size_literal).super_VectorView<bool>.ptr
         [(type_00->array_size_literal).super_VectorView<bool>.buffer_size - 1] == false)))) {
      uVar3 = Compiler::type_struct_member_array_stride((Compiler *)this,type,index);
      uVar4 = get_declared_struct_member_array_stride_msl(this,type,index);
      if (uVar3 != uVar4) goto LAB_0022872f;
    }
    bVar1 = Compiler::is_matrix((Compiler *)this,type_00);
    if (bVar1) {
      uVar3 = Compiler::type_struct_member_matrix_stride((Compiler *)this,type,index);
      uVar4 = get_declared_struct_member_matrix_stride_msl(this,type,index);
      if (uVar3 != uVar4) goto LAB_0022872f;
    }
    uVar3 = get_declared_struct_member_alignment_msl(this,type,index);
    bVar1 = uVar2 % uVar3 == 0;
  }
  return bVar1;
}

Assistant:

bool CompilerMSL::validate_member_packing_rules_msl(const SPIRType &type, uint32_t index) const
{
	auto &mbr_type = get<SPIRType>(type.member_types[index]);
	uint32_t spirv_offset = get_member_decoration(type.self, index, DecorationOffset);

	if (index + 1 < type.member_types.size())
	{
		// First, we will check offsets. If SPIR-V offset + MSL size > SPIR-V offset of next member,
		// we *must* perform some kind of remapping, no way getting around it.
		// We can always pad after this member if necessary, so that case is fine.
		uint32_t spirv_offset_next = get_member_decoration(type.self, index + 1, DecorationOffset);
		assert(spirv_offset_next >= spirv_offset);
		uint32_t maximum_size = spirv_offset_next - spirv_offset;
		uint32_t msl_mbr_size = get_declared_struct_member_size_msl(type, index);
		if (msl_mbr_size > maximum_size)
			return false;
	}

	if (is_array(mbr_type))
	{
		// If we have an array type, array stride must match exactly with SPIR-V.

		// An exception to this requirement is if we have one array element.
		// This comes from DX scalar layout workaround.
		// If app tries to be cheeky and access the member out of bounds, this will not work, but this is the best we can do.
		// In OpAccessChain with logical memory models, access chains must be in-bounds in SPIR-V specification.
		bool relax_array_stride = mbr_type.array.back() == 1 && mbr_type.array_size_literal.back();

		if (!relax_array_stride)
		{
			uint32_t spirv_array_stride = type_struct_member_array_stride(type, index);
			uint32_t msl_array_stride = get_declared_struct_member_array_stride_msl(type, index);
			if (spirv_array_stride != msl_array_stride)
				return false;
		}
	}

	if (is_matrix(mbr_type))
	{
		// Need to check MatrixStride as well.
		uint32_t spirv_matrix_stride = type_struct_member_matrix_stride(type, index);
		uint32_t msl_matrix_stride = get_declared_struct_member_matrix_stride_msl(type, index);
		if (spirv_matrix_stride != msl_matrix_stride)
			return false;
	}

	// Now, we check alignment.
	uint32_t msl_alignment = get_declared_struct_member_alignment_msl(type, index);
	if ((spirv_offset % msl_alignment) != 0)
		return false;

	// We're in the clear.
	return true;
}